

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

uint16 get16bits11bits(int base,int table,int mul,int index)

{
  uint16 sixteenbits;
  int elevenbits;
  int elevenTabVal;
  int sign;
  int tabVal;
  int elevenbase;
  int index_local;
  int mul_local;
  int table_local;
  int base_local;
  
  tabVal = -alphaBase[table][3 - index % 4] + -1;
  if (index / 4 != 1) {
    tabVal = -alphaBase[table][3 - index % 4];
  }
  if (mul == 0) {
    elevenTabVal = (tabVal * 8) / 8;
  }
  else {
    elevenTabVal = mul * tabVal * 8;
  }
  if (index / 4 != 1) {
    elevenTabVal = -elevenTabVal;
  }
  elevenbits = base * 8 + 4 + elevenTabVal;
  if (elevenbits < 0x800) {
    if (elevenbits < 0) {
      elevenbits = 0;
    }
  }
  else {
    elevenbits = 0x7ff;
  }
  return (short)(elevenbits << 5) + (short)(elevenbits >> 6);
}

Assistant:

uint16 get16bits11bits(int base, int table, int mul, int index) 
{
	int elevenbase = base*8+4;

	//i want the positive value here
	int tabVal = -alphaBase[table][3-index%4]-1;
	//and the sign, please
	int sign = 1-(index/4);
	
	if(sign)
		tabVal=tabVal+1;
	int elevenTabVal = tabVal*8;

	if(mul!=0)
		elevenTabVal*=mul;
	else
		elevenTabVal/=8;

	if(sign)
		elevenTabVal=-elevenTabVal;

	//calculate sum
	int elevenbits = elevenbase+elevenTabVal;

	//clamp..
	if(elevenbits>=256*8)
		elevenbits=256*8-1;
	else if(elevenbits<0)
		elevenbits=0;
	//elevenbits now contains the 11 bit alpha value as defined in the spec.

	//extend to 16 bits before returning, since we don't have any good 11-bit file formats.
	uint16 sixteenbits = (elevenbits<<5)+(elevenbits>>6);

	return sixteenbits;
}